

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O0

bool ImGui::SelectPath(char *popupId,string *path)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  unsigned_long *puVar7;
  reference pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  size_t lastSlash;
  bool ret;
  undefined1 in_stack_00001837;
  string *in_stack_00001838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff78;
  ImVec2 in_stack_ffffffffffffff80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  ImVec2 local_48 [4];
  byte local_25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  if ((SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_),
     iVar2 != 0)) {
    in_stack_ffffffffffffff78 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&stack0xffffffffffffffef;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
    __cxa_atexit(std::__cxx11::string::~string,
                 &SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_);
  }
  if ((SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_),
     iVar2 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1fb866);
    __cxa_atexit(std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~vector,&SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&SelectPath(char_const*,std::__cxx11::string&)::_l_abi_cxx11_);
  }
  local_25 = 0;
  bVar1 = BeginPopup((char *)in_stack_ffffffffffffff78,
                     (ImGuiWindowFlags)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      LTRemoveXPSystemPath(in_stack_ffffffffffffff70);
    }
    else {
      psVar4 = DataRefs::GetXPSystemPath_abi_cxx11_(&dataRefs);
      std::__cxx11::string::operator=((string *)local_10,(string *)psVar4);
    }
    uVar3 = std::__cxx11::string::size();
    if ((1 < uVar3) && (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 == '/')) {
      std::__cxx11::string::pop_back();
    }
    bVar1 = std::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)&SelectPath(char_const*,std::__cxx11::string&)::_p_abi_cxx11_,
                 (string *)local_10);
      GetDirContents(in_stack_00001838,(bool)in_stack_00001837);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff80);
    }
    bVar1 = std::operator!=(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    if (bVar1) {
      ImVec2::ImVec2(local_48,0.0,0.0);
      bVar1 = Selectable((char *)__range2,__begin2._M_current._7_1_,
                         (ImGuiSelectableFlags)__begin2._M_current,(ImVec2 *)__end2._M_current);
      if (bVar1) {
        lVar6 = std::__cxx11::string::find_last_of((char *)local_10,0x3ca4db);
        if (lVar6 == -1) {
          std::__cxx11::string::clear();
        }
        else {
          in_stack_ffffffffffffff70 = local_10;
          puVar7 = std::max<unsigned_long>
                             ((unsigned_long *)&stack0xffffffffffffffb0,
                              (unsigned_long *)&stack0xffffffffffffffa8);
          std::__cxx11::string::erase((ulong)in_stack_ffffffffffffff70,*puVar7);
        }
        local_25 = 1;
      }
    }
    local_68._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_ffffffffffffff68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      pbVar8 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_68);
      in_stack_ffffffffffffff68 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::c_str();
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,0.0,0.0);
      bVar1 = Selectable((char *)__range2,__begin2._M_current._7_1_,
                         (ImGuiSelectableFlags)__begin2._M_current,(ImVec2 *)__end2._M_current);
      if (bVar1) {
        bVar1 = std::operator!=(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
        if (bVar1) {
          std::__cxx11::string::operator+=((string *)local_10,'/');
        }
        std::__cxx11::string::operator+=((string *)local_10,(string *)pbVar8);
        local_25 = 1;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_68);
    }
    EndPopup();
  }
  return (bool)(local_25 & 1);
}

Assistant:

IMGUI_API bool SelectPath (const char* popupId, std::string& path)
{
    static std::string _p ("<uninit>");
    static std::vector<std::string> _l;

    bool ret = false;
    if (BeginPopup(popupId))
    {
        // Replace an empty path with X-Plane's root
        if (path.empty())
            path = dataRefs.GetXPSystemPath();
        // If a path starts with system path, strip the system path
        else {
#if IBM
            // Replace any backslashes with forward slashes as XP seems to do that internally, too
            for (char& c : path)
                if (c == '\\') c = '/';
            // except for the one after the drive letter
            if (path.length() >= 2 && path[1] == ':') {
                // Windows drive letter -> upper case
                path[0] = (char)toupper(path[0]);
                // that slash afterwards needs to be a backslash
                if (path.length() >= 3 && path[2] == '/')
                    path[2] = '\\';
            }
#endif
            LTRemoveXPSystemPath(path);
        }
        
        // make sure path doesn't end on slash
        // (but keep a single slash for "root"...and as the one after a Windows drive letter is kept as backslash it won't be removed either
        if (path.size() > 1 && path.back() == '/')
            path.pop_back();
        
        // make sure we have the proper list of subdirectories
        if (_p != path) {
            _p = path;
            _l = GetDirContents(path,true);
        }
        
        // Can we offer a "dir up" entry?
#if IBM
        if (path.size() > 3 && path[1] == ':')
#else
        if (path != "/")
#endif
        {
            if (Selectable(ICON_FA_LEVEL_UP_ALT)) {
                size_t lastSlash = path.find_last_of(PATH_DELIMS);
                if (lastSlash != std::string::npos)
                    path.erase(std::max(lastSlash, size_t(1)));// one level up, but keep a single slash for root
                else
                    path.clear();                   // nothing left
                ret = true;                         // something selected
            }
        }
        
        // Subdirs of that path, as a Listbox
        for (const std::string& s: _l) {
            if (Selectable(s.c_str())) {
                if (path != "/")
                    path += '/';                // always use forward slash, also on Windows
                path += s;                      // one level down
                ret = true;                     // something selected
            }
        }
        
        EndPopup();
    }
    
    return ret;
}